

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ushort uVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  size_t k;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  byte bVar24;
  byte bVar25;
  byte bVar26;
  int iVar27;
  byte bVar28;
  long lVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  ulong uVar32;
  ushort uVar33;
  long lVar34;
  ulong *puVar35;
  NodeRef root;
  long lVar36;
  undefined4 uVar37;
  float *pfVar38;
  bool bVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar72;
  float fVar73;
  vint4 bi_8;
  undefined1 auVar67 [16];
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  uint uVar75;
  uint uVar83;
  uint uVar84;
  vint4 ai_2;
  undefined1 auVar76 [16];
  uint uVar85;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  float fVar86;
  vint4 bi;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 in_ZMM2 [64];
  vint4 bi_1;
  undefined1 auVar93 [16];
  vint4 bi_3;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  vint4 ai;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  vint4 ai_1;
  undefined1 auVar107 [16];
  vint4 ai_13;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  vint4 ai_3;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  vfloat<8> upper_x;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  TravRayK<4,_false> tray;
  vfloat<8> lower_x;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  byte local_39b4;
  Precalculations local_3981;
  undefined1 local_3980 [8];
  float fStack_3978;
  float fStack_3974;
  uint local_3968;
  uint local_3964;
  undefined1 local_3960 [16];
  undefined1 local_3950 [16];
  float local_3940;
  float fStack_393c;
  float fStack_3938;
  float fStack_3934;
  Geometry *local_3930;
  undefined4 local_3924;
  RTCFilterFunctionNArguments local_3920;
  RayK<4> *local_38e0;
  long local_38d8;
  long local_38d0;
  ulong local_38c8;
  undefined1 local_38c0 [32];
  undefined1 local_3890 [16];
  undefined1 local_3880 [16];
  undefined1 local_3870 [16];
  BVH *local_3860;
  Intersectors *local_3858;
  long local_3850;
  long local_3848;
  long local_3840;
  ulong local_3838;
  float local_3830;
  float fStack_382c;
  float fStack_3828;
  float fStack_3824;
  RTCHitN local_3820 [16];
  undefined1 auStack_3810 [16];
  undefined1 local_3800 [16];
  undefined1 local_37f0 [16];
  undefined1 local_37e0 [8];
  float fStack_37d8;
  float fStack_37d4;
  undefined1 local_37d0 [16];
  undefined1 local_37c0 [16];
  uint local_37b0;
  uint uStack_37ac;
  uint uStack_37a8;
  uint uStack_37a4;
  uint uStack_37a0;
  uint uStack_379c;
  uint uStack_3798;
  uint uStack_3794;
  undefined1 local_3780 [32];
  undefined1 local_3760 [32];
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3740;
  undefined1 local_3710 [16];
  undefined1 local_3700 [16];
  undefined1 local_36f0 [16];
  undefined1 local_36e0 [16];
  undefined1 local_36d0 [16];
  undefined1 local_36c0 [16];
  float local_36b0;
  float fStack_36ac;
  float fStack_36a8;
  float fStack_36a4;
  undefined1 local_36a0 [16];
  float local_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  undefined1 local_3680 [16];
  undefined1 local_3670 [16];
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  float local_3630;
  float fStack_362c;
  float fStack_3628;
  float fStack_3624;
  float local_3620;
  float fStack_361c;
  float fStack_3618;
  float fStack_3614;
  float local_3610;
  float fStack_360c;
  float fStack_3608;
  float fStack_3604;
  undefined1 local_3600 [32];
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 local_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 local_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 local_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 local_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 local_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 local_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 local_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  size_t local_34f8;
  ulong local_34f0 [560];
  undefined1 local_2370 [16];
  undefined1 local_2360 [16];
  undefined1 local_2350 [8992];
  
  local_34f8 = (((BVH *)This->ptr)->root).ptr;
  if (local_34f8 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar42 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar46 = ZEXT816(0) << 0x40;
      uVar12 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar46,5);
      uVar40 = vpcmpeqd_avx512vl(auVar42,(undefined1  [16])valid_i->field_0);
      uVar40 = ((byte)uVar12 & 0xf) & uVar40;
      bVar26 = (byte)uVar40;
      if (bVar26 != 0) {
        local_3740._0_4_ = *(float *)ray;
        local_3740._4_4_ = *(float *)(ray + 4);
        local_3740._8_4_ = *(float *)(ray + 8);
        local_3740._12_4_ = *(float *)(ray + 0xc);
        local_3740._16_4_ = *(float *)(ray + 0x10);
        local_3740._20_4_ = *(float *)(ray + 0x14);
        local_3740._24_4_ = *(float *)(ray + 0x18);
        local_3740._28_4_ = *(float *)(ray + 0x1c);
        local_3740._32_4_ = *(float *)(ray + 0x20);
        local_3740._36_4_ = *(float *)(ray + 0x24);
        local_3740._40_4_ = *(float *)(ray + 0x28);
        local_3740._44_4_ = *(float *)(ray + 0x2c);
        local_3710 = *(undefined1 (*) [16])(ray + 0x40);
        local_3700 = *(undefined1 (*) [16])(ray + 0x50);
        local_36f0 = *(undefined1 (*) [16])(ray + 0x60);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar124 = ZEXT1664(auVar42);
        local_3924 = (undefined4)uVar40;
        auVar43 = vandps_avx512vl(local_3710,auVar42);
        auVar45._8_4_ = 0x219392ef;
        auVar45._0_8_ = 0x219392ef219392ef;
        auVar45._12_4_ = 0x219392ef;
        uVar32 = vcmpps_avx512vl(auVar43,auVar45,1);
        bVar39 = (bool)((byte)uVar32 & 1);
        auVar43._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3710._0_4_;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3710._4_4_;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3710._8_4_;
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3710._12_4_;
        auVar44 = vandps_avx512vl(local_3700,auVar42);
        uVar32 = vcmpps_avx512vl(auVar44,auVar45,1);
        bVar39 = (bool)((byte)uVar32 & 1);
        auVar44._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3700._0_4_;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3700._4_4_;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3700._8_4_;
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_3700._12_4_;
        auVar42 = vandps_avx512vl(local_36f0,auVar42);
        uVar32 = vcmpps_avx512vl(auVar42,auVar45,1);
        bVar39 = (bool)((byte)uVar32 & 1);
        auVar63._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_36f0._0_4_;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar63._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_36f0._4_4_;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar63._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_36f0._8_4_;
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar63._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * local_36f0._12_4_;
        auVar45 = vrcp14ps_avx512vl(auVar43);
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar42 = vfnmadd213ps_fma(auVar43,auVar45,auVar47);
        local_36e0 = vfmadd132ps_fma(auVar42,auVar45,auVar45);
        auVar43 = vrcp14ps_avx512vl(auVar44);
        auVar42 = vfnmadd213ps_fma(auVar44,auVar43,auVar47);
        local_36d0 = vfmadd132ps_fma(auVar42,auVar43,auVar43);
        auVar43 = vrcp14ps_avx512vl(auVar63);
        auVar42 = vfnmadd213ps_fma(auVar63,auVar43,auVar47);
        local_36c0 = vfmadd132ps_fma(auVar42,auVar43,auVar43);
        uVar32 = vcmpps_avx512vl(local_36e0,auVar46,1);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_3680._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar42._4_4_;
        local_3680._0_4_ = (uint)((byte)uVar32 & 1) * auVar42._0_4_;
        local_3680._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar42._8_4_;
        local_3680._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar42._12_4_;
        uVar32 = vcmpps_avx512vl(local_36d0,auVar46,5);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar39 = (bool)((byte)uVar32 & 1);
        local_3670._0_4_ = (uint)bVar39 * auVar42._0_4_ | (uint)!bVar39 * 0x60;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        local_3670._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * 0x60;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        local_3670._8_4_ = (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * 0x60;
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        local_3670._12_4_ = (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * 0x60;
        local_36a0._0_4_ = *(float *)(ray + 0x10) * local_36d0._0_4_;
        local_36a0._4_4_ = *(float *)(ray + 0x14) * local_36d0._4_4_;
        local_36a0._8_4_ = *(float *)(ray + 0x18) * local_36d0._8_4_;
        local_36a0._12_4_ = *(float *)(ray + 0x1c) * local_36d0._12_4_;
        uVar32 = vcmpps_avx512vl(local_36c0,auVar46,5);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar39 = (bool)((byte)uVar32 & 1);
        local_3660._0_4_ = (uint)bVar39 * auVar42._0_4_ | (uint)!bVar39 * 0xa0;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        local_3660._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * 0xa0;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        local_3660._8_4_ = (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * 0xa0;
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        local_3660._12_4_ = (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * 0xa0;
        local_36b0 = *(float *)ray * local_36e0._0_4_;
        fStack_36ac = *(float *)(ray + 4) * local_36e0._4_4_;
        fStack_36a8 = *(float *)(ray + 8) * local_36e0._8_4_;
        fStack_36a4 = *(float *)(ray + 0xc) * local_36e0._12_4_;
        local_3690 = *(float *)(ray + 0x20) * local_36c0._0_4_;
        fStack_368c = *(float *)(ray + 0x24) * local_36c0._4_4_;
        fStack_3688 = *(float *)(ray + 0x28) * local_36c0._8_4_;
        fStack_3684 = *(float *)(ray + 0x2c) * local_36c0._12_4_;
        local_2370 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar126 = ZEXT1664(local_2370);
        auVar42 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar46);
        local_3650._0_4_ =
             (uint)(bVar26 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar26 & 1) * local_2370._0_4_;
        bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
        local_3650._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * local_2370._4_4_;
        bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
        local_3650._8_4_ = (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * local_2370._8_4_;
        bVar39 = SUB81(uVar40 >> 3,0);
        local_3650._12_4_ = (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * local_2370._12_4_;
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar125 = ZEXT1664(auVar42);
        auVar46 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar46);
        local_3640._0_4_ =
             (uint)(bVar26 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar42._0_4_;
        bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
        local_3640._4_4_ = (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * auVar42._4_4_;
        bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
        local_3640._8_4_ = (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * auVar42._8_4_;
        bVar39 = SUB81(uVar40 >> 3,0);
        local_3640._12_4_ = (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * auVar42._12_4_;
        local_3858 = This;
        local_3860 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar32 = 3;
        }
        else {
          uVar32 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
        }
        local_38e0 = ray + 0x80;
        uVar33 = (ushort)uVar40 ^ 0xf;
        puVar35 = local_34f0;
        pauVar30 = (undefined1 (*) [16])local_2350;
        local_3500 = 0xfffffffffffffff8;
        local_2360 = local_3650;
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar127 = ZEXT1664(auVar42);
        auVar42 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar129 = ZEXT1664(auVar42);
        local_38c8 = uVar32;
LAB_00777f08:
        do {
          local_39b4 = (byte)uVar33;
          auVar42 = auVar125._0_16_;
          do {
            root.ptr = puVar35[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_007791f1;
            puVar35 = puVar35 + -1;
            _local_3980 = pauVar30[-1];
            auVar82 = ZEXT1664(_local_3980);
            pauVar30 = pauVar30 + -1;
            uVar40 = vcmpps_avx512vl(_local_3980,local_3640,1);
          } while ((char)uVar40 == '\0');
          uVar37 = (undefined4)uVar40;
          if (uVar32 < (uint)POPCOUNT(uVar37)) {
LAB_00777f50:
            do {
              local_39b4 = (byte)uVar33;
              uVar40 = 8;
              auVar42 = auVar125._0_16_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007791f1;
                uVar12 = vcmpps_avx512vl(auVar82._0_16_,local_3640,9);
                if ((char)uVar12 != '\0') {
                  bVar26 = (byte)(uVar33 & 0xff0f);
                  local_3850 = (ulong)((uint)root.ptr & 0xf) - 8;
                  if (local_3850 != 0) {
                    uVar40 = root.ptr & 0xfffffffffffffff0;
                    uVar33 = uVar33 & 0xff0f ^ 0xf;
                    lVar29 = 0;
                    do {
                      local_3848 = lVar29;
                      lVar29 = lVar29 * 0x90;
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = *(ulong *)(uVar40 + 0x40 + lVar29);
                      auVar55._8_8_ = 0;
                      auVar55._0_8_ = *(ulong *)(uVar40 + 0x48 + lVar29);
                      uVar31 = vpcmpub_avx512vl(auVar42,auVar55,2);
                      if ((char)uVar31 != '\0') {
                        lVar29 = lVar29 + uVar40;
                        uVar31 = uVar31 & 0xff;
                        local_3840 = lVar29;
                        do {
                          lVar34 = 0;
                          for (uVar41 = uVar31; (uVar41 & 1) == 0;
                              uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                            lVar34 = lVar34 + 1;
                          }
                          auVar56._8_8_ = 0;
                          auVar56._0_8_ = *(ulong *)(lVar29 + 0x40);
                          auVar71 = vpmovzxbd_avx2(auVar56);
                          auVar71 = vcvtdq2ps_avx(auVar71);
                          uVar37 = *(undefined4 *)(lVar29 + 0x7c);
                          auVar79._4_4_ = uVar37;
                          auVar79._0_4_ = uVar37;
                          auVar79._8_4_ = uVar37;
                          auVar79._12_4_ = uVar37;
                          auVar79._16_4_ = uVar37;
                          auVar79._20_4_ = uVar37;
                          auVar79._24_4_ = uVar37;
                          auVar79._28_4_ = uVar37;
                          uVar37 = *(undefined4 *)(lVar29 + 0x70);
                          auVar90._4_4_ = uVar37;
                          auVar90._0_4_ = uVar37;
                          auVar90._8_4_ = uVar37;
                          auVar90._12_4_ = uVar37;
                          auVar90._16_4_ = uVar37;
                          auVar90._20_4_ = uVar37;
                          auVar90._24_4_ = uVar37;
                          auVar90._28_4_ = uVar37;
                          auVar42 = vfmadd213ps_fma(auVar71,auVar79,auVar90);
                          local_3600 = ZEXT1632(auVar42);
                          auVar57._8_8_ = 0;
                          auVar57._0_8_ = *(ulong *)(lVar29 + 0x48);
                          auVar71 = vpmovzxbd_avx2(auVar57);
                          auVar71 = vcvtdq2ps_avx(auVar71);
                          auVar42 = vfmadd213ps_fma(auVar71,auVar79,auVar90);
                          _local_3820 = ZEXT1632(auVar42);
                          auVar58._8_8_ = 0;
                          auVar58._0_8_ = *(ulong *)(lVar29 + 0x50);
                          auVar71 = vpmovzxbd_avx2(auVar58);
                          uVar37 = *(undefined4 *)(lVar29 + 0x80);
                          auVar80._4_4_ = uVar37;
                          auVar80._0_4_ = uVar37;
                          auVar80._8_4_ = uVar37;
                          auVar80._12_4_ = uVar37;
                          auVar80._16_4_ = uVar37;
                          auVar80._20_4_ = uVar37;
                          auVar80._24_4_ = uVar37;
                          auVar80._28_4_ = uVar37;
                          auVar71 = vcvtdq2ps_avx(auVar71);
                          uVar37 = *(undefined4 *)(lVar29 + 0x74);
                          auVar91._4_4_ = uVar37;
                          auVar91._0_4_ = uVar37;
                          auVar91._8_4_ = uVar37;
                          auVar91._12_4_ = uVar37;
                          auVar91._16_4_ = uVar37;
                          auVar91._20_4_ = uVar37;
                          auVar91._24_4_ = uVar37;
                          auVar91._28_4_ = uVar37;
                          auVar42 = vfmadd213ps_fma(auVar71,auVar80,auVar91);
                          auVar71 = ZEXT1632(auVar42);
                          local_3920.valid = (int *)auVar71._0_8_;
                          local_3920.geometryUserPtr = (void *)auVar71._8_8_;
                          local_3920.context = (RTCRayQueryContext *)auVar71._16_8_;
                          local_3920.ray = (RTCRayN *)auVar71._24_8_;
                          auVar59._8_8_ = 0;
                          auVar59._0_8_ = *(ulong *)(lVar29 + 0x58);
                          auVar71 = vpmovzxbd_avx2(auVar59);
                          auVar71 = vcvtdq2ps_avx(auVar71);
                          auVar42 = vfmadd213ps_fma(auVar71,auVar80,auVar91);
                          local_38c0 = ZEXT1632(auVar42);
                          auVar60._8_8_ = 0;
                          auVar60._0_8_ = *(ulong *)(lVar29 + 0x60);
                          auVar71 = vpmovzxbd_avx2(auVar60);
                          uVar37 = *(undefined4 *)(lVar29 + 0x84);
                          auVar81._4_4_ = uVar37;
                          auVar81._0_4_ = uVar37;
                          auVar81._8_4_ = uVar37;
                          auVar81._12_4_ = uVar37;
                          auVar81._16_4_ = uVar37;
                          auVar81._20_4_ = uVar37;
                          auVar81._24_4_ = uVar37;
                          auVar81._28_4_ = uVar37;
                          uVar37 = *(undefined4 *)(lVar29 + 0x78);
                          auVar92._4_4_ = uVar37;
                          auVar92._0_4_ = uVar37;
                          auVar92._8_4_ = uVar37;
                          auVar92._12_4_ = uVar37;
                          auVar92._16_4_ = uVar37;
                          auVar92._20_4_ = uVar37;
                          auVar92._24_4_ = uVar37;
                          auVar92._28_4_ = uVar37;
                          auVar71 = vcvtdq2ps_avx(auVar71);
                          auVar42 = vfmadd213ps_fma(auVar71,auVar81,auVar92);
                          local_3760 = ZEXT1632(auVar42);
                          auVar61._8_8_ = 0;
                          auVar61._0_8_ = *(ulong *)(lVar29 + 0x68);
                          auVar71 = vpmovzxbd_avx2(auVar61);
                          auVar71 = vcvtdq2ps_avx(auVar71);
                          auVar42 = vfmadd213ps_fma(auVar71,auVar81,auVar92);
                          local_3780 = ZEXT1632(auVar42);
                          auVar123._4_4_ = fStack_36ac;
                          auVar123._0_4_ = local_36b0;
                          auVar123._8_4_ = fStack_36a8;
                          auVar123._12_4_ = fStack_36a4;
                          uVar41 = (ulong)(uint)((int)lVar34 * 4);
                          uVar37 = *(undefined4 *)(local_3600 + uVar41);
                          auVar94._4_4_ = uVar37;
                          auVar94._0_4_ = uVar37;
                          auVar94._8_4_ = uVar37;
                          auVar94._12_4_ = uVar37;
                          auVar43 = vfmsub132ps_fma(auVar94,auVar123,local_36e0);
                          uVar37 = *(undefined4 *)((long)&local_3920.valid + uVar41);
                          auVar105._4_4_ = uVar37;
                          auVar105._0_4_ = uVar37;
                          auVar105._8_4_ = uVar37;
                          auVar105._12_4_ = uVar37;
                          auVar19._4_4_ = fStack_368c;
                          auVar19._0_4_ = local_3690;
                          auVar19._8_4_ = fStack_3688;
                          auVar19._12_4_ = fStack_3684;
                          uVar37 = *(undefined4 *)(local_3760 + uVar41);
                          auVar108._4_4_ = uVar37;
                          auVar108._0_4_ = uVar37;
                          auVar108._8_4_ = uVar37;
                          auVar108._12_4_ = uVar37;
                          auVar44 = vfmsub132ps_fma(auVar105,local_36a0,local_36d0);
                          auVar63 = vfmsub132ps_fma(auVar108,auVar19,local_36c0);
                          uVar37 = *(undefined4 *)(local_3820 + uVar41);
                          auVar62._4_4_ = uVar37;
                          auVar62._0_4_ = uVar37;
                          auVar62._8_4_ = uVar37;
                          auVar62._12_4_ = uVar37;
                          auVar45 = vfmsub132ps_avx512vl(local_36e0,auVar123,auVar62);
                          uVar37 = *(undefined4 *)(local_38c0 + uVar41);
                          auVar128._4_4_ = uVar37;
                          auVar128._0_4_ = uVar37;
                          auVar128._8_4_ = uVar37;
                          auVar128._12_4_ = uVar37;
                          auVar47 = vfmsub132ps_avx512vl(local_36d0,local_36a0,auVar128);
                          uVar37 = *(undefined4 *)(local_3780 + uVar41);
                          auVar64._4_4_ = uVar37;
                          auVar64._0_4_ = uVar37;
                          auVar64._8_4_ = uVar37;
                          auVar64._12_4_ = uVar37;
                          auVar48 = vfmsub132ps_avx512vl(local_36c0,auVar19,auVar64);
                          auVar42 = vpminsd_avx(auVar43,auVar45);
                          auVar46 = vpminsd_avx(auVar44,auVar47);
                          auVar42 = vpmaxsd_avx(auVar42,auVar46);
                          auVar46 = vpminsd_avx(auVar63,auVar48);
                          auVar42 = vpmaxsd_avx(auVar42,auVar46);
                          auVar46 = vpmaxsd_avx(auVar43,auVar45);
                          auVar43 = vpmaxsd_avx(auVar44,auVar47);
                          auVar43 = vpminsd_avx(auVar46,auVar43);
                          auVar46 = vpmaxsd_avx(auVar63,auVar48);
                          auVar46 = vpminsd_avx(auVar43,auVar46);
                          auVar42 = vpmaxsd_avx(auVar42,local_3650);
                          auVar46 = vpminsd_avx(auVar46,local_3640);
                          uVar12 = vpcmpd_avx512vl(auVar42,auVar46,2);
                          bVar26 = (byte)uVar33;
                          if ((bVar26 & (byte)uVar12 & 0xf) == 0) {
                            bVar39 = false;
                          }
                          else {
                            local_3838 = uVar31;
                            uVar33 = *(ushort *)(lVar29 + lVar34 * 8);
                            uVar5 = *(ushort *)(lVar29 + 2 + lVar34 * 8);
                            pGVar6 = (context->scene->geometries).items[*(uint *)(lVar29 + 0x88)].
                                     ptr;
                            local_38d0 = *(long *)&pGVar6->field_0x58;
                            lVar7 = *(long *)&pGVar6[1].time_range.upper;
                            local_38d8 = (ulong)*(uint *)(lVar29 + 4 + lVar34 * 8) *
                                         pGVar6[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                            local_3964 = uVar33 & 0x7fff;
                            local_3968 = uVar5 & 0x7fff;
                            uVar75 = *(uint *)(local_38d0 + 4 + local_38d8);
                            uVar32 = (ulong)uVar75;
                            uVar41 = (ulong)(uVar75 * local_3968 +
                                            *(int *)(local_38d0 + local_38d8) + local_3964);
                            p_Var8 = pGVar6[1].intersectionFilterN;
                            puVar2 = (undefined8 *)(lVar7 + (uVar41 + 1) * (long)p_Var8);
                            local_3600._16_8_ = *puVar2;
                            local_3600._24_8_ = puVar2[1];
                            lVar29 = uVar41 + uVar32;
                            puVar2 = (undefined8 *)(lVar7 + lVar29 * (long)p_Var8);
                            local_35d0 = *puVar2;
                            uStack_35c8 = puVar2[1];
                            lVar34 = uVar41 + uVar32 + 1;
                            puVar2 = (undefined8 *)(lVar7 + lVar34 * (long)p_Var8);
                            local_35e0 = *puVar2;
                            uStack_35d8 = puVar2[1];
                            uVar31 = (ulong)(-1 < (short)uVar33);
                            puVar2 = (undefined8 *)(lVar7 + (uVar41 + uVar31 + 1) * (long)p_Var8);
                            lVar36 = uVar31 + lVar34;
                            puVar3 = (undefined8 *)(lVar7 + lVar36 * (long)p_Var8);
                            local_35a0 = *puVar3;
                            uStack_3598 = puVar3[1];
                            if ((short)uVar5 < 0) {
                              uVar32 = 0;
                            }
                            puVar3 = (undefined8 *)(lVar7 + (lVar29 + uVar32) * (long)p_Var8);
                            puVar4 = (undefined8 *)(lVar7 + (lVar34 + uVar32) * (long)p_Var8);
                            local_3560 = *puVar4;
                            uStack_3558 = puVar4[1];
                            puVar4 = (undefined8 *)(lVar7 + (uVar32 + lVar36) * (long)p_Var8);
                            auVar42 = vpbroadcastd_avx512vl();
                            auVar82 = ZEXT1664(auVar42);
                            local_3600._0_16_ =
                                 *(undefined1 (*) [16])(lVar7 + (long)p_Var8 * uVar41);
                            local_35c0 = local_3600._16_8_;
                            uStack_35b8 = local_3600._24_8_;
                            local_35b0 = *puVar2;
                            uStack_35a8 = puVar2[1];
                            local_3590 = local_35e0;
                            uStack_3588 = uStack_35d8;
                            local_3580 = local_35d0;
                            uStack_3578 = uStack_35c8;
                            local_3570 = local_35e0;
                            uStack_3568 = uStack_35d8;
                            local_3550 = *puVar3;
                            uStack_3548 = puVar3[1];
                            local_3540 = local_35e0;
                            uStack_3538 = uStack_35d8;
                            local_3530 = local_35a0;
                            uStack_3528 = uStack_3598;
                            local_3520 = *puVar4;
                            uStack_3518 = puVar4[1];
                            local_3510 = local_3560;
                            uStack_3508 = uStack_3558;
                            auVar42 = vpbroadcastd_avx512vl();
                            auVar130 = ZEXT1664(auVar42);
                            pfVar38 = (float *)&uStack_35c8;
                            uVar32 = 0;
                            bVar25 = bVar26;
                            do {
                              fVar66 = pfVar38[-0xe];
                              auVar76._4_4_ = fVar66;
                              auVar76._0_4_ = fVar66;
                              auVar76._8_4_ = fVar66;
                              auVar76._12_4_ = fVar66;
                              fVar72 = pfVar38[-0xd];
                              auVar99._4_4_ = fVar72;
                              auVar99._0_4_ = fVar72;
                              auVar99._8_4_ = fVar72;
                              auVar99._12_4_ = fVar72;
                              fVar73 = pfVar38[-0xc];
                              auVar111._4_4_ = fVar73;
                              auVar111._0_4_ = fVar73;
                              auVar111._8_4_ = fVar73;
                              auVar111._12_4_ = fVar73;
                              local_3610 = pfVar38[-10];
                              local_3620 = pfVar38[-9];
                              local_3630 = pfVar38[-8];
                              auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar38[-6]));
                              auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar38[-5]));
                              auVar52 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar38[-4]));
                              fVar74 = pfVar38[-2];
                              local_3980._4_4_ = pfVar38[-1];
                              local_3940 = *pfVar38;
                              auVar42 = vmovdqa64_avx512vl(auVar130._0_16_);
                              local_3760._0_16_ = auVar42;
                              auVar42 = vmovdqa64_avx512vl(auVar82._0_16_);
                              local_3780._0_16_ = auVar42;
                              fStack_360c = local_3610;
                              fStack_3608 = local_3610;
                              fStack_3604 = local_3610;
                              fVar86 = fVar66 - local_3610;
                              auVar114._4_4_ = fVar86;
                              auVar114._0_4_ = fVar86;
                              auVar114._8_4_ = fVar86;
                              auVar114._12_4_ = fVar86;
                              fStack_361c = local_3620;
                              fStack_3618 = local_3620;
                              fStack_3614 = local_3620;
                              fVar115 = fVar72 - local_3620;
                              auVar116._4_4_ = fVar115;
                              auVar116._0_4_ = fVar115;
                              auVar116._8_4_ = fVar115;
                              auVar116._12_4_ = fVar115;
                              fStack_362c = local_3630;
                              fStack_3628 = local_3630;
                              fStack_3624 = local_3630;
                              fVar110 = fVar73 - local_3630;
                              auVar119._4_4_ = fVar110;
                              auVar119._0_4_ = fVar110;
                              auVar119._8_4_ = fVar110;
                              auVar119._12_4_ = fVar110;
                              auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar74 - fVar66)));
                              local_3980._0_4_ = local_3980._4_4_;
                              fStack_3978 = (float)local_3980._4_4_;
                              fStack_3974 = (float)local_3980._4_4_;
                              auVar54 = vbroadcastss_avx512vl
                                                  (ZEXT416((uint)((float)local_3980._4_4_ - fVar72))
                                                  );
                              auVar55 = vbroadcastss_avx512vl(ZEXT416((uint)(local_3940 - fVar73)));
                              fVar115 = fVar115 * (local_3940 - fVar73);
                              auVar106._4_4_ = fVar115;
                              auVar106._0_4_ = fVar115;
                              auVar106._8_4_ = fVar115;
                              auVar106._12_4_ = fVar115;
                              auVar56 = vfmsub231ps_avx512vl(auVar106,auVar54,auVar119);
                              fVar110 = fVar110 * (fVar74 - fVar66);
                              auVar107._4_4_ = fVar110;
                              auVar107._0_4_ = fVar110;
                              auVar107._8_4_ = fVar110;
                              auVar107._12_4_ = fVar110;
                              auVar57 = vfmsub231ps_avx512vl(auVar107,auVar55,auVar114);
                              fVar86 = ((float)local_3980._4_4_ - fVar72) * fVar86;
                              auVar109._4_4_ = fVar86;
                              auVar109._0_4_ = fVar86;
                              auVar109._8_4_ = fVar86;
                              auVar109._12_4_ = fVar86;
                              auVar42 = *(undefined1 (*) [16])ray;
                              auVar46 = *(undefined1 (*) [16])(ray + 0x10);
                              auVar43 = *(undefined1 (*) [16])(ray + 0x20);
                              auVar44 = *(undefined1 (*) [16])(ray + 0x40);
                              auVar58 = vfmsub231ps_avx512vl(auVar109,auVar53,auVar116);
                              auVar47 = vsubps_avx(auVar76,auVar42);
                              auVar48 = vsubps_avx(auVar99,auVar46);
                              auVar49 = vsubps_avx(auVar111,auVar43);
                              auVar63 = *(undefined1 (*) [16])(ray + 0x50);
                              auVar45 = *(undefined1 (*) [16])(ray + 0x60);
                              auVar59 = vmulps_avx512vl(auVar63,auVar49);
                              auVar59 = vfmsub231ps_avx512vl(auVar59,auVar48,auVar45);
                              auVar60 = vmulps_avx512vl(auVar45,auVar47);
                              auVar60 = vfmsub231ps_avx512vl(auVar60,auVar49,auVar44);
                              auVar61 = vmulps_avx512vl(auVar44,auVar48);
                              auVar61 = vfmsub231ps_avx512vl(auVar61,auVar47,auVar63);
                              auVar62 = vmulps_avx512vl(auVar55,auVar61);
                              auVar54 = vfmadd231ps_avx512vl(auVar62,auVar60,auVar54);
                              auVar62 = vmulps_avx512vl(auVar58,auVar45);
                              auVar62 = vfmadd231ps_avx512vl(auVar62,auVar57,auVar63);
                              auVar62 = vfmadd231ps_avx512vl(auVar62,auVar56,auVar44);
                              auVar53 = vfmadd231ps_avx512vl(auVar54,auVar59,auVar53);
                              auVar54 = vandps_avx512vl(auVar62,auVar127._0_16_);
                              auVar53 = vxorps_avx512vl(auVar54,auVar53);
                              auVar128 = auVar129._0_16_;
                              uVar12 = vcmpps_avx512vl(auVar53,auVar128,5);
                              bVar28 = (byte)uVar12 & bVar25;
                              fStack_393c = local_3940;
                              fStack_3938 = local_3940;
                              fStack_3934 = local_3940;
                              if (bVar28 != 0) {
                                auVar61 = vmulps_avx512vl(auVar119,auVar61);
                                auVar60 = vfmadd213ps_avx512vl(auVar60,auVar116,auVar61);
                                auVar59 = vfmadd213ps_avx512vl(auVar59,auVar114,auVar60);
                                auVar60 = vxorps_avx512vl(auVar54,auVar59);
                                uVar12 = vcmpps_avx512vl(auVar60,auVar128,5);
                                bVar28 = bVar28 & (byte)uVar12;
                                if (bVar28 != 0) {
                                  auVar123 = auVar124._0_16_;
                                  auVar64 = vandps_avx512vl(auVar62,auVar123);
                                  auVar61 = vsubps_avx(auVar64,auVar53);
                                  uVar12 = vcmpps_avx512vl(auVar61,auVar60,5);
                                  bVar28 = bVar28 & (byte)uVar12;
                                  if (bVar28 != 0) {
                                    local_3890 = auVar52;
                                    local_3880 = auVar51;
                                    local_3870 = auVar50;
                                    local_3960 = vmovdqa64_avx512vl(auVar130._0_16_);
                                    local_3950 = vmovdqa64_avx512vl(auVar82._0_16_);
                                    auVar50 = vxorps_avx512vl(auVar59,auVar59);
                                    auVar120._0_4_ = auVar58._0_4_ * auVar49._0_4_;
                                    auVar120._4_4_ = auVar58._4_4_ * auVar49._4_4_;
                                    auVar120._8_4_ = auVar58._8_4_ * auVar49._8_4_;
                                    auVar120._12_4_ = auVar58._12_4_ * auVar49._12_4_;
                                    auVar48 = vfmadd213ps_fma(auVar48,auVar57,auVar120);
                                    auVar47 = vfmadd213ps_fma(auVar47,auVar56,auVar48);
                                    auVar47 = vxorps_avx512vl(auVar54,auVar47);
                                    fVar66 = auVar64._0_4_;
                                    auVar117._0_4_ = fVar66 * *(float *)(ray + 0x30);
                                    fVar72 = auVar64._4_4_;
                                    auVar117._4_4_ = fVar72 * *(float *)(ray + 0x34);
                                    fVar73 = auVar64._8_4_;
                                    auVar117._8_4_ = fVar73 * *(float *)(ray + 0x38);
                                    fVar115 = auVar64._12_4_;
                                    auVar117._12_4_ = fVar115 * *(float *)(ray + 0x3c);
                                    local_3830 = *(float *)(ray + 0x80);
                                    fStack_382c = *(float *)(ray + 0x84);
                                    fStack_3828 = *(float *)(ray + 0x88);
                                    fStack_3824 = *(float *)(ray + 0x8c);
                                    auVar121._0_4_ = fVar66 * local_3830;
                                    auVar121._4_4_ = fVar72 * fStack_382c;
                                    auVar121._8_4_ = fVar73 * fStack_3828;
                                    auVar121._12_4_ = fVar115 * fStack_3824;
                                    uVar12 = vcmpps_avx512vl(auVar47,auVar121,2);
                                    uVar13 = vcmpps_avx512vl(auVar117,auVar47,1);
                                    bVar28 = bVar28 & (byte)uVar12 & (byte)uVar13;
                                    if (bVar28 == 0) {
LAB_00778ab7:
                                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar51 = vxorps_avx512vl(auVar128,auVar128);
                                      auVar52 = vmovdqa64_avx512vl(local_3950);
                                      auVar53 = vmovdqa64_avx512vl(local_3960);
                                    }
                                    else {
                                      uVar12 = vcmpps_avx512vl(auVar62,auVar50,4);
                                      bVar28 = bVar28 & (byte)uVar12;
                                      if (bVar28 == 0) goto LAB_00778ab7;
                                      local_3930 = (context->scene->geometries).items
                                                   [*(uint *)(local_3760 + uVar32 * 4)].ptr;
                                      uVar75 = local_3930->mask;
                                      auVar118._4_4_ = uVar75;
                                      auVar118._0_4_ = uVar75;
                                      auVar118._8_4_ = uVar75;
                                      auVar118._12_4_ = uVar75;
                                      uVar12 = vptestmd_avx512vl(auVar118,*(undefined1 (*) [16])
                                                                           (ray + 0x90));
                                      bVar24 = (byte)uVar12 & 0xf & bVar28;
                                      if (bVar24 == 0) goto LAB_00778ab7;
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (local_3930->occlusionFilterN != (RTCFilterFunctionN)0x0))
                                      {
                                        auVar42 = vcvtsi2ss_avx512f(auVar123,*(ushort *)
                                                                              (local_38d0 + 8 +
                                                                              local_38d8) - 1);
                                        auVar46 = vcvtsi2ss_avx512f(auVar123,*(ushort *)
                                                                              (local_38d0 + 10 +
                                                                              local_38d8) - 1);
                                        auVar43 = vcvtsi2ss_avx512f(auVar123,((uint)uVar32 & 1) +
                                                                             local_3964);
                                        auVar44 = vcvtsi2ss_avx512f(auVar123,((uint)(uVar32 >> 1) &
                                                                             0x7fffffff) +
                                                                             local_3968);
                                        local_37c0 = vpbroadcastd_avx512vl();
                                        auVar103._4_12_ = SUB1612((undefined1  [16])0x0,4);
                                        auVar103._0_4_ = auVar42._0_4_;
                                        auVar63 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar103);
                                        auVar42 = vfnmadd213ss_fma(auVar42,auVar63,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar110 = auVar63._0_4_ * auVar42._0_4_;
                                        fVar86 = auVar43._0_4_;
                                        auVar89._0_4_ = auVar53._0_4_ + fVar66 * fVar86;
                                        auVar89._4_4_ = auVar53._4_4_ + fVar72 * fVar86;
                                        auVar89._8_4_ = auVar53._8_4_ + fVar73 * fVar86;
                                        auVar89._12_4_ = auVar53._12_4_ + fVar115 * fVar86;
                                        auVar68._4_4_ = fVar110;
                                        auVar68._0_4_ = fVar110;
                                        auVar68._8_4_ = fVar110;
                                        auVar68._12_4_ = fVar110;
                                        auVar43 = vmulps_avx512vl(auVar89,auVar68);
                                        bVar39 = (bool)(bVar28 >> 1 & 1);
                                        bVar10 = (bool)(bVar28 >> 2 & 1);
                                        auVar69._4_12_ = SUB1612((undefined1  [16])0x0,4);
                                        auVar69._0_4_ = auVar46._0_4_;
                                        auVar63 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar69);
                                        auVar42 = vfnmadd213ss_fma(auVar46,auVar63,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar110 = auVar63._0_4_ * auVar42._0_4_;
                                        fVar86 = auVar44._0_4_;
                                        auVar78._0_4_ = auVar60._0_4_ + fVar66 * fVar86;
                                        auVar78._4_4_ = auVar60._4_4_ + fVar72 * fVar86;
                                        auVar78._8_4_ = auVar60._8_4_ + fVar73 * fVar86;
                                        auVar78._12_4_ = auVar60._12_4_ + fVar115 * fVar86;
                                        auVar70._4_4_ = fVar110;
                                        auVar70._0_4_ = fVar110;
                                        auVar70._8_4_ = fVar110;
                                        auVar70._12_4_ = fVar110;
                                        auVar46 = vmulps_avx512vl(auVar78,auVar70);
                                        bVar9 = (bool)(bVar28 >> 1 & 1);
                                        bVar11 = (bool)(bVar28 >> 2 & 1);
                                        auVar42 = vrcp14ps_avx512vl(auVar64);
                                        auVar15._8_4_ = 0x3f800000;
                                        auVar15._0_8_ = 0x3f8000003f800000;
                                        auVar15._12_4_ = 0x3f800000;
                                        auVar44 = vfnmadd213ps_avx512vl(auVar64,auVar42,auVar15);
                                        auVar42 = vfmadd132ps_fma(auVar44,auVar42,auVar42);
                                        local_37f0._0_4_ =
                                             (float)((uint)(bVar28 & 1) * auVar43._0_4_ |
                                                    (uint)!(bool)(bVar28 & 1) * (int)auVar53._0_4_)
                                             * auVar42._0_4_;
                                        local_37f0._4_4_ =
                                             (float)((uint)bVar39 * auVar43._4_4_ |
                                                    (uint)!bVar39 * (int)auVar53._4_4_) *
                                             auVar42._4_4_;
                                        local_37f0._8_4_ =
                                             (float)((uint)bVar10 * auVar43._8_4_ |
                                                    (uint)!bVar10 * (int)auVar53._8_4_) *
                                             auVar42._8_4_;
                                        local_37f0._12_4_ =
                                             (float)((uint)(bVar28 >> 3) * auVar43._12_4_ |
                                                    (uint)!(bool)(bVar28 >> 3) * (int)auVar53._12_4_
                                                    ) * auVar42._12_4_;
                                        local_37d0 = vpbroadcastd_avx512vl();
                                        auStack_3810 = auVar57;
                                        local_3820 = (RTCHitN  [16])auVar56;
                                        local_3800 = auVar58;
                                        local_37e0._4_4_ =
                                             (float)((uint)bVar9 * auVar46._4_4_ |
                                                    (uint)!bVar9 * (int)auVar60._4_4_) *
                                             auVar42._4_4_;
                                        local_37e0._0_4_ =
                                             (float)((uint)(bVar28 & 1) * auVar46._0_4_ |
                                                    (uint)!(bool)(bVar28 & 1) * (int)auVar60._0_4_)
                                             * auVar42._0_4_;
                                        fStack_37d8 = (float)((uint)bVar11 * auVar46._8_4_ |
                                                             (uint)!bVar11 * (int)auVar60._8_4_) *
                                                      auVar42._8_4_;
                                        fStack_37d4 = (float)((uint)(bVar28 >> 3) * auVar46._12_4_ |
                                                             (uint)!(bool)(bVar28 >> 3) *
                                                             (int)auVar60._12_4_) * auVar42._12_4_;
                                        vpcmpeqd_avx2(ZEXT1632(local_37f0),ZEXT1632(local_37f0));
                                        uStack_37ac = context->user->instID[0];
                                        local_37b0 = uStack_37ac;
                                        uStack_37a8 = uStack_37ac;
                                        uStack_37a4 = uStack_37ac;
                                        uStack_37a0 = context->user->instPrimID[0];
                                        uStack_379c = uStack_37a0;
                                        uStack_3798 = uStack_37a0;
                                        uStack_3794 = uStack_37a0;
                                        auVar42 = vmulps_avx512vl(auVar42,auVar47);
                                        bVar39 = (bool)(bVar24 >> 1 & 1);
                                        bVar9 = (bool)(bVar24 >> 2 & 1);
                                        *(uint *)(ray + 0x80) =
                                             (uint)(bVar24 & 1) * auVar42._0_4_ |
                                             (uint)!(bool)(bVar24 & 1) * (int)local_3830;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar39 * auVar42._4_4_ |
                                             (uint)!bVar39 * (int)fStack_382c;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar9 * auVar42._8_4_ |
                                             (uint)!bVar9 * (int)fStack_3828;
                                        *(uint *)(ray + 0x8c) =
                                             (uint)(bVar24 >> 3) * auVar42._12_4_ |
                                             (uint)!(bool)(bVar24 >> 3) * (int)fStack_3824;
                                        auVar42 = vpmovm2d_avx512vl((ulong)bVar24);
                                        local_38c0._0_16_ = auVar42;
                                        local_3920.geometryUserPtr = local_3930->userPtr;
                                        local_3920.valid = (int *)local_38c0;
                                        local_3920.context = context->user;
                                        local_3920.ray = (RTCRayN *)ray;
                                        local_3920.hit = local_3820;
                                        local_3920.N = 4;
                                        if (local_3930->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                        {
                                          (*local_3930->occlusionFilterN)(&local_3920);
                                          auVar42 = local_38c0._0_16_;
                                        }
                                        uVar31 = vptestmd_avx512vl(auVar42,auVar42);
                                        if ((uVar31 & 0xf) == 0) {
                                          uVar31 = 0;
                                        }
                                        else {
                                          p_Var8 = context->args->filter;
                                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((local_3930->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var8)(&local_3920);
                                            auVar42 = local_38c0._0_16_;
                                          }
                                          uVar31 = vptestmd_avx512vl(auVar42,auVar42);
                                          uVar31 = uVar31 & 0xf;
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar39 = (bool)((byte)uVar31 & 1);
                                          bVar9 = (bool)((byte)(uVar31 >> 1) & 1);
                                          bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
                                          bVar11 = SUB81(uVar31 >> 3,0);
                                          *(uint *)(local_3920.ray + 0x80) =
                                               (uint)bVar39 * auVar42._0_4_ |
                                               (uint)!bVar39 * *(int *)(local_3920.ray + 0x80);
                                          *(uint *)(local_3920.ray + 0x84) =
                                               (uint)bVar9 * auVar42._4_4_ |
                                               (uint)!bVar9 * *(int *)(local_3920.ray + 0x84);
                                          *(uint *)(local_3920.ray + 0x88) =
                                               (uint)bVar10 * auVar42._8_4_ |
                                               (uint)!bVar10 * *(int *)(local_3920.ray + 0x88);
                                          *(uint *)(local_3920.ray + 0x8c) =
                                               (uint)bVar11 * auVar42._12_4_ |
                                               (uint)!bVar11 * *(int *)(local_3920.ray + 0x8c);
                                        }
                                        bVar24 = (byte)uVar31;
                                        bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
                                        bVar9 = (bool)((byte)(uVar31 >> 2) & 1);
                                        bVar10 = SUB81(uVar31 >> 3,0);
                                        *(uint *)(ray + 0x80) =
                                             (uint)(bVar24 & 1) * *(int *)(ray + 0x80) |
                                             (uint)!(bool)(bVar24 & 1) * (int)local_3830;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar39 * *(int *)(ray + 0x84) |
                                             (uint)!bVar39 * (int)fStack_382c;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar9 * *(int *)(ray + 0x88) |
                                             (uint)!bVar9 * (int)fStack_3828;
                                        *(uint *)(ray + 0x8c) =
                                             (uint)bVar10 * *(int *)(ray + 0x8c) |
                                             (uint)!bVar10 * (int)fStack_3824;
                                        auVar42 = *(undefined1 (*) [16])ray;
                                        auVar46 = *(undefined1 (*) [16])(ray + 0x10);
                                        auVar43 = *(undefined1 (*) [16])(ray + 0x20);
                                        auVar44 = *(undefined1 (*) [16])(ray + 0x40);
                                        auVar63 = *(undefined1 (*) [16])(ray + 0x50);
                                        auVar45 = *(undefined1 (*) [16])(ray + 0x60);
                                      }
                                      bVar25 = (bVar24 ^ 0xf) & bVar25;
                                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar51 = vxorps_avx512vl(auVar128,auVar128);
                                      auVar52 = vmovdqa64_avx512vl(local_3950);
                                      auVar53 = vmovdqa64_avx512vl(local_3960);
                                    }
                                    auVar130 = ZEXT1664(auVar53);
                                    auVar82 = ZEXT1664(auVar52);
                                    auVar129 = ZEXT1664(auVar51);
                                    auVar127 = ZEXT1664(auVar50);
                                    auVar126 = ZEXT1664(auVar49);
                                    auVar125 = ZEXT1664(auVar48);
                                    auVar124 = ZEXT1664(auVar47);
                                    auVar50 = local_3870;
                                    auVar51 = local_3880;
                                    auVar52 = local_3890;
                                  }
                                }
                              }
                              auVar17._4_4_ = fVar74;
                              auVar17._0_4_ = fVar74;
                              auVar17._8_4_ = fVar74;
                              auVar17._12_4_ = fVar74;
                              auVar18._4_4_ = fStack_393c;
                              auVar18._0_4_ = local_3940;
                              auVar18._8_4_ = fStack_3938;
                              auVar18._12_4_ = fStack_3934;
                              auVar48 = vsubps_avx512vl(auVar50,auVar17);
                              auVar49 = vsubps_avx512vl(auVar51,_local_3980);
                              auVar53 = vsubps_avx512vl(auVar52,auVar18);
                              auVar22._4_4_ = fStack_360c;
                              auVar22._0_4_ = local_3610;
                              auVar22._8_4_ = fStack_3608;
                              auVar22._12_4_ = fStack_3604;
                              auVar54 = vsubps_avx512vl(auVar22,auVar50);
                              auVar21._4_4_ = fStack_361c;
                              auVar21._0_4_ = local_3620;
                              auVar21._8_4_ = fStack_3618;
                              auVar21._12_4_ = fStack_3614;
                              auVar56 = vsubps_avx512vl(auVar21,auVar51);
                              auVar20._4_4_ = fStack_362c;
                              auVar20._0_4_ = local_3630;
                              auVar20._8_4_ = fStack_3628;
                              auVar20._12_4_ = fStack_3624;
                              auVar57 = vsubps_avx512vl(auVar20,auVar52);
                              auVar47 = vmulps_avx512vl(auVar49,auVar57);
                              auVar58 = vfmsub231ps_avx512vl(auVar47,auVar56,auVar53);
                              auVar47 = vmulps_avx512vl(auVar53,auVar54);
                              auVar59 = vfmsub231ps_avx512vl(auVar47,auVar57,auVar48);
                              auVar47 = vmulps_avx512vl(auVar48,auVar56);
                              auVar60 = vfmsub231ps_avx512vl(auVar47,auVar54,auVar49);
                              auVar50 = vsubps_avx512vl(auVar50,auVar42);
                              auVar51 = vsubps_avx512vl(auVar51,auVar46);
                              auVar52 = vsubps_avx512vl(auVar52,auVar43);
                              auVar87._0_4_ = auVar52._0_4_ * auVar63._0_4_;
                              auVar87._4_4_ = auVar52._4_4_ * auVar63._4_4_;
                              auVar87._8_4_ = auVar52._8_4_ * auVar63._8_4_;
                              auVar87._12_4_ = auVar52._12_4_ * auVar63._12_4_;
                              auVar46 = vfmsub231ps_fma(auVar87,auVar51,auVar45);
                              auVar93._0_4_ = auVar50._0_4_ * auVar45._0_4_;
                              auVar93._4_4_ = auVar50._4_4_ * auVar45._4_4_;
                              auVar93._8_4_ = auVar50._8_4_ * auVar45._8_4_;
                              auVar93._12_4_ = auVar50._12_4_ * auVar45._12_4_;
                              auVar43 = vfmsub231ps_fma(auVar93,auVar52,auVar44);
                              auVar122._0_4_ = auVar51._0_4_ * auVar44._0_4_;
                              auVar122._4_4_ = auVar51._4_4_ * auVar44._4_4_;
                              auVar122._8_4_ = auVar51._8_4_ * auVar44._8_4_;
                              auVar122._12_4_ = auVar51._12_4_ * auVar44._12_4_;
                              auVar47 = vfmsub231ps_fma(auVar122,auVar50,auVar63);
                              auVar95._0_4_ = auVar60._0_4_ * auVar45._0_4_;
                              auVar95._4_4_ = auVar60._4_4_ * auVar45._4_4_;
                              auVar95._8_4_ = auVar60._8_4_ * auVar45._8_4_;
                              auVar95._12_4_ = auVar60._12_4_ * auVar45._12_4_;
                              auVar42 = vfmadd231ps_fma(auVar95,auVar59,auVar63);
                              auVar42 = vfmadd231ps_fma(auVar42,auVar58,auVar44);
                              auVar44 = vandps_avx512vl(auVar42,auVar127._0_16_);
                              auVar63 = vmulps_avx512vl(auVar57,auVar47);
                              auVar63 = vfmadd231ps_avx512vl(auVar63,auVar43,auVar56);
                              auVar63 = vfmadd231ps_avx512vl(auVar63,auVar46,auVar54);
                              uVar75 = auVar44._0_4_;
                              auVar100._0_4_ = uVar75 ^ auVar63._0_4_;
                              uVar83 = auVar44._4_4_;
                              auVar100._4_4_ = uVar83 ^ auVar63._4_4_;
                              uVar84 = auVar44._8_4_;
                              auVar100._8_4_ = uVar84 ^ auVar63._8_4_;
                              uVar85 = auVar44._12_4_;
                              auVar100._12_4_ = uVar85 ^ auVar63._12_4_;
                              auVar44 = auVar129._0_16_;
                              uVar12 = vcmpps_avx512vl(auVar100,auVar44,5);
                              bVar28 = (byte)uVar12 & bVar25;
                              if (bVar28 != 0) {
                                auVar67._0_4_ = auVar53._0_4_ * auVar47._0_4_;
                                auVar67._4_4_ = auVar53._4_4_ * auVar47._4_4_;
                                auVar67._8_4_ = auVar53._8_4_ * auVar47._8_4_;
                                auVar67._12_4_ = auVar53._12_4_ * auVar47._12_4_;
                                auVar43 = vfmadd213ps_fma(auVar43,auVar49,auVar67);
                                auVar46 = vfmadd213ps_fma(auVar46,auVar48,auVar43);
                                auVar88._0_4_ = uVar75 ^ auVar46._0_4_;
                                auVar88._4_4_ = uVar83 ^ auVar46._4_4_;
                                auVar88._8_4_ = uVar84 ^ auVar46._8_4_;
                                auVar88._12_4_ = uVar85 ^ auVar46._12_4_;
                                uVar12 = vcmpps_avx512vl(auVar88,auVar44,5);
                                bVar28 = bVar28 & (byte)uVar12;
                                if (bVar28 != 0) {
                                  auVar43 = vandps_avx512vl(auVar42,auVar124._0_16_);
                                  auVar46 = vsubps_avx(auVar43,auVar100);
                                  uVar12 = vcmpps_avx512vl(auVar46,auVar88,5);
                                  bVar28 = bVar28 & (byte)uVar12;
                                  if (bVar28 != 0) {
                                    local_3960 = vmovdqa64_avx512vl(auVar130._0_16_);
                                    local_3950 = vmovdqa64_avx512vl(auVar82._0_16_);
                                    auVar101._0_4_ = auVar60._0_4_ * auVar52._0_4_;
                                    auVar101._4_4_ = auVar60._4_4_ * auVar52._4_4_;
                                    auVar101._8_4_ = auVar60._8_4_ * auVar52._8_4_;
                                    auVar101._12_4_ = auVar60._12_4_ * auVar52._12_4_;
                                    auVar63 = vfmadd213ps_fma(auVar51,auVar59,auVar101);
                                    auVar63 = vfmadd213ps_fma(auVar50,auVar58,auVar63);
                                    auVar77._0_4_ = auVar63._0_4_ ^ uVar75;
                                    auVar77._4_4_ = auVar63._4_4_ ^ uVar83;
                                    auVar77._8_4_ = auVar63._8_4_ ^ uVar84;
                                    auVar77._12_4_ = auVar63._12_4_ ^ uVar85;
                                    fVar66 = auVar43._0_4_;
                                    auVar102._0_4_ = fVar66 * *(float *)(ray + 0x30);
                                    fVar72 = auVar43._4_4_;
                                    auVar102._4_4_ = fVar72 * *(float *)(ray + 0x34);
                                    fVar73 = auVar43._8_4_;
                                    auVar102._8_4_ = fVar73 * *(float *)(ray + 0x38);
                                    fVar74 = auVar43._12_4_;
                                    auVar102._12_4_ = fVar74 * *(float *)(ray + 0x3c);
                                    pRVar1 = ray + 0x80;
                                    auVar23 = *(undefined1 (*) [12])pRVar1;
                                    auVar63 = *(undefined1 (*) [16])pRVar1;
                                    auVar112._0_4_ = *(float *)pRVar1 * fVar66;
                                    auVar112._4_4_ = *(float *)(ray + 0x84) * fVar72;
                                    auVar112._8_4_ = *(float *)(ray + 0x88) * fVar73;
                                    auVar112._12_4_ = *(float *)(ray + 0x8c) * fVar74;
                                    uVar12 = vcmpps_avx512vl(auVar77,auVar112,2);
                                    uVar13 = vcmpps_avx512vl(auVar102,auVar77,1);
                                    bVar28 = bVar28 & (byte)uVar12 & (byte)uVar13;
                                    if (bVar28 != 0) {
                                      uVar12 = vcmpps_avx512vl(auVar42,ZEXT816(0) << 0x20,4);
                                      bVar28 = bVar28 & (byte)uVar12;
                                      if (bVar28 != 0) {
                                        pGVar6 = (context->scene->geometries).items
                                                 [*(uint *)(local_3760 + uVar32 * 4)].ptr;
                                        uVar75 = pGVar6->mask;
                                        auVar96._4_4_ = uVar75;
                                        auVar96._0_4_ = uVar75;
                                        auVar96._8_4_ = uVar75;
                                        auVar96._12_4_ = uVar75;
                                        uVar12 = vptestmd_avx512vl(auVar96,*(undefined1 (*) [16])
                                                                            (ray + 0x90));
                                        bVar24 = (byte)uVar12 & 0xf & bVar28;
                                        if (bVar24 != 0) {
                                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                             (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0))
                                          {
                                            auVar42 = vcvtsi2ss_avx512f(auVar55,*(ushort *)
                                                                                 (local_38d0 + 8 +
                                                                                 local_38d8) - 1);
                                            auVar45 = vcvtsi2ss_avx512f(auVar55,*(ushort *)
                                                                                 (local_38d0 + 10 +
                                                                                 local_38d8) - 1);
                                            auVar47 = vcvtsi2ss_avx512f(auVar55,((uint)uVar32 & 1) +
                                                                                local_3964);
                                            auVar48 = vcvtsi2ss_avx512f(auVar55,((uint)(uVar32 >> 1)
                                                                                & 0x7fffffff) +
                                                                                local_3968);
                                            local_37c0 = vpbroadcastd_avx512vl();
                                            auVar16._12_4_ = 0;
                                            auVar16._0_12_ = ZEXT812(0);
                                            auVar49 = vrcp14ss_avx512f(auVar16 << 0x20,
                                                                       ZEXT416(auVar42._0_4_));
                                            auVar42 = vfnmadd213ss_fma(auVar42,auVar49,
                                                                       SUB6416(ZEXT464(0x40000000),0
                                                                              ));
                                            fVar115 = auVar49._0_4_ * auVar42._0_4_;
                                            fVar110 = auVar47._0_4_;
                                            auVar113._0_4_ = fVar110 * fVar66 + auVar46._0_4_;
                                            auVar113._4_4_ = fVar110 * fVar72 + auVar46._4_4_;
                                            auVar113._8_4_ = fVar110 * fVar73 + auVar46._8_4_;
                                            auVar113._12_4_ = fVar110 * fVar74 + auVar46._12_4_;
                                            auVar97._4_4_ = fVar115;
                                            auVar97._0_4_ = fVar115;
                                            auVar97._8_4_ = fVar115;
                                            auVar97._12_4_ = fVar115;
                                            auVar47 = vmulps_avx512vl(auVar113,auVar97);
                                            bVar39 = (bool)(bVar28 >> 1 & 1);
                                            bVar10 = (bool)(bVar28 >> 2 & 1);
                                            auVar49 = vrcp14ss_avx512f(auVar16 << 0x20,
                                                                       ZEXT416(auVar45._0_4_));
                                            auVar42 = vfnmadd213ss_fma(auVar45,auVar49,
                                                                       SUB6416(ZEXT464(0x40000000),0
                                                                              ));
                                            fVar115 = auVar49._0_4_ * auVar42._0_4_;
                                            auVar42 = vsubps_avx(auVar43,auVar88);
                                            fVar110 = auVar48._0_4_;
                                            auVar104._0_4_ = fVar110 * fVar66 + auVar42._0_4_;
                                            auVar104._4_4_ = fVar110 * fVar72 + auVar42._4_4_;
                                            auVar104._8_4_ = fVar110 * fVar73 + auVar42._8_4_;
                                            auVar104._12_4_ = fVar110 * fVar74 + auVar42._12_4_;
                                            auVar98._4_4_ = fVar115;
                                            auVar98._0_4_ = fVar115;
                                            auVar98._8_4_ = fVar115;
                                            auVar98._12_4_ = fVar115;
                                            auVar45 = vmulps_avx512vl(auVar104,auVar98);
                                            bVar9 = (bool)(bVar28 >> 1 & 1);
                                            bVar11 = (bool)(bVar28 >> 2 & 1);
                                            auVar48 = vrcp14ps_avx512vl(auVar43);
                                            auVar14._8_4_ = 0x3f800000;
                                            auVar14._0_8_ = 0x3f8000003f800000;
                                            auVar14._12_4_ = 0x3f800000;
                                            auVar43 = vfnmadd213ps_avx512vl(auVar43,auVar48,auVar14)
                                            ;
                                            auVar43 = vfmadd132ps_fma(auVar43,auVar48,auVar48);
                                            local_37f0._0_4_ =
                                                 (float)((uint)(bVar28 & 1) * auVar47._0_4_ |
                                                        (uint)!(bool)(bVar28 & 1) *
                                                        (int)auVar46._0_4_) * auVar43._0_4_;
                                            local_37f0._4_4_ =
                                                 (float)((uint)bVar39 * auVar47._4_4_ |
                                                        (uint)!bVar39 * (int)auVar46._4_4_) *
                                                 auVar43._4_4_;
                                            local_37f0._8_4_ =
                                                 (float)((uint)bVar10 * auVar47._8_4_ |
                                                        (uint)!bVar10 * (int)auVar46._8_4_) *
                                                 auVar43._8_4_;
                                            local_37f0._12_4_ =
                                                 (float)((uint)(bVar28 >> 3) * auVar47._12_4_ |
                                                        (uint)!(bool)(bVar28 >> 3) *
                                                        (int)auVar46._12_4_) * auVar43._12_4_;
                                            local_37e0._0_4_ =
                                                 (float)((uint)(bVar28 & 1) * auVar45._0_4_ |
                                                        (uint)!(bool)(bVar28 & 1) *
                                                        (int)auVar42._0_4_) * auVar43._0_4_;
                                            local_37e0._4_4_ =
                                                 (float)((uint)bVar9 * auVar45._4_4_ |
                                                        (uint)!bVar9 * (int)auVar42._4_4_) *
                                                 auVar43._4_4_;
                                            fStack_37d8 = (float)((uint)bVar11 * auVar45._8_4_ |
                                                                 (uint)!bVar11 * (int)auVar42._8_4_)
                                                          * auVar43._8_4_;
                                            fStack_37d4 = (float)((uint)(bVar28 >> 3) *
                                                                  auVar45._12_4_ |
                                                                 (uint)!(bool)(bVar28 >> 3) *
                                                                 (int)auVar42._12_4_) *
                                                          auVar43._12_4_;
                                            local_37d0 = vpbroadcastd_avx512vl();
                                            auStack_3810 = auVar59;
                                            local_3820 = (RTCHitN  [16])auVar58;
                                            local_3800 = auVar60;
                                            vpcmpeqd_avx2(ZEXT1632(_local_37e0),
                                                          ZEXT1632(_local_37e0));
                                            uStack_37ac = context->user->instID[0];
                                            local_37b0 = uStack_37ac;
                                            uStack_37a8 = uStack_37ac;
                                            uStack_37a4 = uStack_37ac;
                                            uStack_37a0 = context->user->instPrimID[0];
                                            uStack_379c = uStack_37a0;
                                            uStack_3798 = uStack_37a0;
                                            uStack_3794 = uStack_37a0;
                                            local_3980._0_4_ = auVar23._0_4_;
                                            local_3980._4_4_ = auVar23._4_4_;
                                            fStack_3978 = auVar23._8_4_;
                                            auVar42 = vmulps_avx512vl(auVar43,auVar77);
                                            auVar65._0_4_ =
                                                 (uint)(bVar24 & 1) * auVar42._0_4_ |
                                                 (uint)!(bool)(bVar24 & 1) * local_3980._0_4_;
                                            bVar39 = (bool)(bVar24 >> 1 & 1);
                                            auVar65._4_4_ =
                                                 (uint)bVar39 * auVar42._4_4_ |
                                                 (uint)!bVar39 * local_3980._4_4_;
                                            bVar39 = (bool)(bVar24 >> 2 & 1);
                                            auVar65._8_4_ =
                                                 (uint)bVar39 * auVar42._8_4_ |
                                                 (uint)!bVar39 * (int)fStack_3978;
                                            auVar65._12_4_ =
                                                 (uint)(bVar24 >> 3) * auVar42._12_4_ |
                                                 (uint)!(bool)(bVar24 >> 3) *
                                                 (int)*(float *)(ray + 0x8c);
                                            *(undefined1 (*) [16])(ray + 0x80) = auVar65;
                                            auVar42 = vpmovm2d_avx512vl((ulong)bVar24);
                                            local_38c0._0_16_ = auVar42;
                                            local_3920.geometryUserPtr = pGVar6->userPtr;
                                            local_3920.valid = (int *)local_38c0;
                                            local_3920.context = context->user;
                                            local_3920.ray = (RTCRayN *)ray;
                                            local_3920.hit = local_3820;
                                            local_3920.N = 4;
                                            _local_3980 = auVar63;
                                            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                            {
                                              (*pGVar6->occlusionFilterN)(&local_3920);
                                              auVar42 = local_38c0._0_16_;
                                            }
                                            uVar31 = vptestmd_avx512vl(auVar42,auVar42);
                                            if ((uVar31 & 0xf) == 0) {
                                              uVar31 = 0;
                                            }
                                            else {
                                              p_Var8 = context->args->filter;
                                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                                 (((context->args->flags &
                                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                  (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                                (*p_Var8)(&local_3920);
                                                auVar42 = local_38c0._0_16_;
                                              }
                                              uVar31 = vptestmd_avx512vl(auVar42,auVar42);
                                              uVar31 = uVar31 & 0xf;
                                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                              bVar39 = (bool)((byte)uVar31 & 1);
                                              bVar9 = (bool)((byte)(uVar31 >> 1) & 1);
                                              bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
                                              bVar11 = SUB81(uVar31 >> 3,0);
                                              *(uint *)(local_3920.ray + 0x80) =
                                                   (uint)bVar39 * auVar42._0_4_ |
                                                   (uint)!bVar39 * *(int *)(local_3920.ray + 0x80);
                                              *(uint *)(local_3920.ray + 0x84) =
                                                   (uint)bVar9 * auVar42._4_4_ |
                                                   (uint)!bVar9 * *(int *)(local_3920.ray + 0x84);
                                              *(uint *)(local_3920.ray + 0x88) =
                                                   (uint)bVar10 * auVar42._8_4_ |
                                                   (uint)!bVar10 * *(int *)(local_3920.ray + 0x88);
                                              *(uint *)(local_3920.ray + 0x8c) =
                                                   (uint)bVar11 * auVar42._12_4_ |
                                                   (uint)!bVar11 * *(int *)(local_3920.ray + 0x8c);
                                            }
                                            bVar24 = (byte)uVar31;
                                            bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
                                            bVar9 = (bool)((byte)(uVar31 >> 2) & 1);
                                            bVar10 = SUB81(uVar31 >> 3,0);
                                            *(uint *)local_38e0 =
                                                 (uint)(bVar24 & 1) * *(int *)local_38e0 |
                                                 (uint)!(bool)(bVar24 & 1) * local_3980._0_4_;
                                            *(uint *)(local_38e0 + 4) =
                                                 (uint)bVar39 * *(int *)(local_38e0 + 4) |
                                                 (uint)!bVar39 * local_3980._4_4_;
                                            *(uint *)(local_38e0 + 8) =
                                                 (uint)bVar9 * *(int *)(local_38e0 + 8) |
                                                 (uint)!bVar9 * (int)fStack_3978;
                                            *(uint *)(local_38e0 + 0xc) =
                                                 (uint)bVar10 * *(int *)(local_38e0 + 0xc) |
                                                 (uint)!bVar10 * (int)fStack_3974;
                                          }
                                          bVar25 = (bVar24 ^ 0xf) & bVar25;
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar124 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          auVar125 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar126 = ZEXT1664(auVar42);
                                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar127 = ZEXT1664(auVar42);
                                          auVar42 = vxorps_avx512vl(auVar44,auVar44);
                                          auVar129 = ZEXT1664(auVar42);
                                          auVar42 = vmovdqa64_avx512vl(local_3950);
                                          auVar82 = ZEXT1664(auVar42);
                                          auVar42 = vmovdqa64_avx512vl(local_3960);
                                          auVar130 = ZEXT1664(auVar42);
                                          goto LAB_00778737;
                                        }
                                      }
                                    }
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar124 = ZEXT1664(auVar42);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar125 = ZEXT1664(auVar42);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar126 = ZEXT1664(auVar42);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar127 = ZEXT1664(auVar42);
                                    auVar42 = vxorps_avx512vl(auVar44,auVar44);
                                    auVar129 = ZEXT1664(auVar42);
                                    auVar42 = vmovdqa64_avx512vl(local_3950);
                                    auVar82 = ZEXT1664(auVar42);
                                    auVar42 = vmovdqa64_avx512vl(local_3960);
                                    auVar130 = ZEXT1664(auVar42);
                                  }
                                }
                              }
LAB_00778737:
                              if (bVar25 == 0) break;
                              pfVar38 = pfVar38 + 0x10;
                              bVar39 = uVar32 < 3;
                              uVar32 = uVar32 + 1;
                            } while (bVar39);
                            uVar33 = (ushort)(bVar26 & bVar25);
                            bVar39 = (bVar26 & bVar25) == 0;
                            uVar31 = local_3838;
                            uVar32 = local_38c8;
                            lVar29 = local_3840;
                          }
                        } while ((!bVar39) && (uVar31 = uVar31 - 1 & uVar31, uVar31 != 0));
                      }
                      lVar29 = local_3848 + 1;
                    } while (lVar29 != local_3850);
                    bVar26 = ~(byte)uVar33 & 0xf;
                  }
                  auVar42 = auVar125._0_16_;
                  local_39b4 = local_39b4 | bVar26;
                  uVar33 = (ushort)local_39b4;
                  if (local_39b4 == 0xf) {
                    local_39b4 = 0xf;
                    goto LAB_007791f1;
                  }
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar39 = (bool)(local_39b4 >> 1 & 1);
                  bVar9 = (bool)(local_39b4 >> 2 & 1);
                  bVar10 = (bool)(local_39b4 >> 3 & 1);
                  local_3640._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * local_3640._4_4_
                  ;
                  local_3640._0_4_ =
                       (uint)(local_39b4 & 1) * auVar42._0_4_ |
                       (uint)!(bool)(local_39b4 & 1) * local_3640._0_4_;
                  local_3640._8_4_ = (uint)bVar9 * auVar42._8_4_ | (uint)!bVar9 * local_3640._8_4_;
                  local_3640._12_4_ =
                       (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * local_3640._12_4_;
                }
                goto LAB_00777f08;
              }
              lVar29 = 0;
              auVar42 = auVar126._0_16_;
              do {
                uVar31 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8);
                if (uVar31 == 8) {
                  auVar82 = ZEXT1664(auVar42);
                  break;
                }
                auVar50._4_4_ = fStack_36ac;
                auVar50._0_4_ = local_36b0;
                auVar50._8_4_ = fStack_36a8;
                auVar50._12_4_ = fStack_36a4;
                uVar37 = *(undefined4 *)(root.ptr + 0x40 + lVar29 * 4);
                auVar52._4_4_ = uVar37;
                auVar52._0_4_ = uVar37;
                auVar52._8_4_ = uVar37;
                auVar52._12_4_ = uVar37;
                auVar44 = vfmsub132ps_fma(auVar52,auVar50,local_36e0);
                uVar37 = *(undefined4 *)(root.ptr + 0x80 + lVar29 * 4);
                auVar53._4_4_ = uVar37;
                auVar53._0_4_ = uVar37;
                auVar53._8_4_ = uVar37;
                auVar53._12_4_ = uVar37;
                auVar51._4_4_ = fStack_368c;
                auVar51._0_4_ = local_3690;
                auVar51._8_4_ = fStack_3688;
                auVar51._12_4_ = fStack_3684;
                uVar37 = *(undefined4 *)(root.ptr + 0xc0 + lVar29 * 4);
                auVar54._4_4_ = uVar37;
                auVar54._0_4_ = uVar37;
                auVar54._8_4_ = uVar37;
                auVar54._12_4_ = uVar37;
                auVar63 = vfmsub132ps_fma(auVar53,local_36a0,local_36d0);
                auVar45 = vfmsub132ps_fma(auVar54,auVar51,local_36c0);
                uVar37 = *(undefined4 *)(root.ptr + 0x60 + lVar29 * 4);
                auVar46._4_4_ = uVar37;
                auVar46._0_4_ = uVar37;
                auVar46._8_4_ = uVar37;
                auVar46._12_4_ = uVar37;
                auVar47 = vfmsub132ps_avx512vl(local_36e0,auVar50,auVar46);
                uVar37 = *(undefined4 *)(root.ptr + 0xa0 + lVar29 * 4);
                auVar48._4_4_ = uVar37;
                auVar48._0_4_ = uVar37;
                auVar48._8_4_ = uVar37;
                auVar48._12_4_ = uVar37;
                auVar48 = vfmsub132ps_avx512vl(local_36d0,local_36a0,auVar48);
                uVar37 = *(undefined4 *)(root.ptr + 0xe0 + lVar29 * 4);
                auVar49._4_4_ = uVar37;
                auVar49._0_4_ = uVar37;
                auVar49._8_4_ = uVar37;
                auVar49._12_4_ = uVar37;
                auVar49 = vfmsub132ps_avx512vl(local_36c0,auVar51,auVar49);
                auVar46 = vpminsd_avx(auVar44,auVar47);
                auVar43 = vpminsd_avx(auVar63,auVar48);
                auVar46 = vpmaxsd_avx(auVar46,auVar43);
                auVar43 = vpminsd_avx(auVar45,auVar49);
                auVar46 = vpmaxsd_avx(auVar46,auVar43);
                auVar43 = vpmaxsd_avx(auVar44,auVar47);
                auVar44 = vpmaxsd_avx(auVar63,auVar48);
                auVar44 = vpminsd_avx(auVar43,auVar44);
                auVar43 = vpmaxsd_avx(auVar45,auVar49);
                auVar44 = vpminsd_avx(auVar44,auVar43);
                auVar43 = vpmaxsd_avx(auVar46,local_3650);
                auVar44 = vpminsd_avx(auVar44,local_3640);
                uVar41 = vpcmpd_avx512vl(auVar43,auVar44,2);
                uVar41 = uVar41 & 0xf;
                if ((byte)uVar41 == 0) {
                  auVar82 = ZEXT1664(auVar42);
                  uVar31 = uVar40;
                }
                else {
                  auVar43 = vblendmps_avx512vl(auVar126._0_16_,auVar46);
                  bVar39 = (bool)((byte)uVar41 & 1);
                  bVar9 = (bool)((byte)(uVar41 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar41 >> 2) & 1);
                  bVar11 = SUB81(uVar41 >> 3,0);
                  auVar82 = ZEXT1664(CONCAT412((uint)bVar11 * auVar43._12_4_ |
                                               (uint)!bVar11 * auVar46._12_4_,
                                               CONCAT48((uint)bVar10 * auVar43._8_4_ |
                                                        (uint)!bVar10 * auVar46._8_4_,
                                                        CONCAT44((uint)bVar9 * auVar43._4_4_ |
                                                                 (uint)!bVar9 * auVar46._4_4_,
                                                                 (uint)bVar39 * auVar43._0_4_ |
                                                                 (uint)!bVar39 * auVar46._0_4_))));
                  if (uVar40 != 8) {
                    *puVar35 = uVar40;
                    puVar35 = puVar35 + 1;
                    *pauVar30 = auVar42;
                    pauVar30 = pauVar30 + 1;
                  }
                }
                uVar40 = uVar31;
                lVar29 = lVar29 + 1;
                auVar42 = auVar82._0_16_;
              } while (lVar29 != 8);
              if (uVar40 == 8) goto LAB_007780ba;
              uVar12 = vcmpps_avx512vl(auVar82._0_16_,local_3640,9);
              root.ptr = uVar40;
            } while ((byte)uVar32 < (byte)POPCOUNT((int)uVar12));
            *puVar35 = uVar40;
            puVar35 = puVar35 + 1;
            *pauVar30 = auVar82._0_16_;
            pauVar30 = pauVar30 + 1;
LAB_007780ba:
            iVar27 = 4;
          }
          else {
            do {
              k = 0;
              for (uVar32 = uVar40; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              bVar39 = occluded1(local_3858,local_3860,root,k,&local_3981,ray,
                                 (TravRayK<4,_false> *)&local_3740.field_0,context);
              bVar26 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar39) {
                bVar26 = 0;
              }
              bVar26 = (byte)uVar33 | bVar26;
              uVar33 = (ushort)bVar26;
              uVar40 = uVar40 - 1 & uVar40;
            } while (uVar40 != 0);
            iVar27 = 3;
            if (bVar26 != 0xf) {
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar39 = (bool)(bVar26 >> 1 & 1);
              bVar9 = (bool)(bVar26 >> 2 & 1);
              bVar10 = (bool)(bVar26 >> 3 & 1);
              local_3640._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * local_3640._4_4_;
              local_3640._0_4_ =
                   (uint)(bVar26 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar26 & 1) * local_3640._0_4_
              ;
              local_3640._8_4_ = (uint)bVar9 * auVar42._8_4_ | (uint)!bVar9 * local_3640._8_4_;
              local_3640._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * local_3640._12_4_;
              iVar27 = 2;
            }
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar124 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar125 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar126 = ZEXT1664(auVar42);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar127 = ZEXT1664(auVar42);
            auVar42 = vxorps_avx512vl(auVar129._0_16_,auVar129._0_16_);
            auVar129 = ZEXT1664(auVar42);
            auVar82 = ZEXT1664(_local_3980);
            uVar32 = local_38c8;
            if (local_38c8 < (uint)POPCOUNT(uVar37)) goto LAB_00777f50;
          }
          local_39b4 = (byte)uVar33;
          auVar42 = auVar125._0_16_;
          if (iVar27 == 3) {
LAB_007791f1:
            local_39b4 = local_39b4 & (byte)local_3924;
            bVar39 = (bool)(local_39b4 >> 1 & 1);
            bVar9 = (bool)(local_39b4 >> 2 & 1);
            bVar10 = (bool)(local_39b4 >> 3 & 1);
            *(uint *)local_38e0 =
                 (uint)(local_39b4 & 1) * auVar42._0_4_ |
                 (uint)!(bool)(local_39b4 & 1) * *(int *)local_38e0;
            *(uint *)(local_38e0 + 4) =
                 (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * *(int *)(local_38e0 + 4);
            *(uint *)(local_38e0 + 8) =
                 (uint)bVar9 * auVar42._8_4_ | (uint)!bVar9 * *(int *)(local_38e0 + 8);
            *(uint *)(local_38e0 + 0xc) =
                 (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * *(int *)(local_38e0 + 0xc);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }